

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

optional<pbrt::Point2<int>_> * __thiscall
pstd::optional<pbrt::Point2<int>_>::operator=
          (optional<pbrt::Point2<int>_> *this,optional<pbrt::Point2<int>_> *v)

{
  bool bVar1;
  optional<pbrt::Point2<int>_> *this_00;
  aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)> *paVar2;
  optional<pbrt::Point2<int>_> *in_RSI;
  optional<pbrt::Point2<int>_> *in_RDI;
  optional<pbrt::Point2<int>_> *in_stack_ffffffffffffffe0;
  
  reset(in_stack_ffffffffffffffe0);
  bVar1 = has_value(in_RSI);
  if (bVar1) {
    this_00 = (optional<pbrt::Point2<int>_> *)ptr((optional<pbrt::Point2<int>_> *)0x78f0c7);
    paVar2 = (aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)> *)
             value(this_00);
    this_00->optionalValue = *paVar2;
    in_RDI->set = true;
    reset(this_00);
  }
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU
    optional &operator=(optional &&v) {
        reset();
        if (v.has_value()) {
            new (ptr()) T(std::move(v.value()));
            set = true;
            v.reset();
        }
        return *this;
    }